

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmUnpkDn<(moira::Instr)175,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  u32 v;
  StrWriter *pSVar2;
  Av<(moira::Instr)175,_(moira::Mode)0,_2> local_74;
  Imu<4> local_70 [2];
  int local_68;
  Ims<2> local_60 [2];
  int local_58;
  undefined1 local_50 [8];
  Ea<(moira::Mode)0,_2> ry;
  Ea<(moira::Mode)0,_2> rx;
  u32 ext;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  v = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)0,2>((Ea<(moira::Mode)0,_2> *)&ry.ext2,this,op & 7,addr);
  Op<(moira::Mode)0,2>((Ea<(moira::Mode)0,_2> *)local_50,this,op >> 9 & 7,addr);
  SVar1 = str->style->syntax;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    pSVar2 = StrWriter::operator<<(str);
    local_58 = (str->tab).raw;
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_58);
    pSVar2 = StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)0,_2> *)&ry.ext2);
    pSVar2 = StrWriter::operator<<(pSVar2);
    pSVar2 = StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)0,_2> *)local_50);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Ims<2>::Ims(local_60,v);
    StrWriter::operator<<(pSVar2,local_60[0]);
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    local_68 = (str->tab).raw;
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_68);
    pSVar2 = StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)0,_2> *)&ry.ext2);
    pSVar2 = StrWriter::operator<<(pSVar2);
    pSVar2 = StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)0,_2> *)local_50);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Imu<4>::Imu(local_70,v);
    StrWriter::operator<<(pSVar2,local_70[0]);
    local_74.ext1 = 0;
    StrWriter::operator<<(str,&local_74);
  }
  return;
}

Assistant:

void
Moira::dasmUnpkDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead <Word> (addr);
    auto rx = Op <M,S> ( _____________xxx(op), addr );
    auto ry = Op <M,S> ( ____xxx_________(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Ims<S>(ext);
            break;

        default:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Imu(ext);
            str << Av<I, M, S>{};
    }
}